

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O2

Request<capnp::AnyPointer,_capnp::AnyPointer> * __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::PromiseClient::newCall
          (Request<capnp::AnyPointer,_capnp::AnyPointer> *__return_storage_ptr__,PromiseClient *this
          ,uint64_t interfaceId,uint16_t methodId,Maybe<capnp::MessageSize> *sizeHint)

{
  ClientHook *pCVar1;
  Own<capnp::ClientHook> OStack_68;
  Own<kj::_::PromiseNode> local_58;
  char local_48 [8];
  uint64_t local_40;
  undefined8 uStack_38;
  char local_30 [8];
  undefined4 local_28;
  undefined4 uStack_24;
  uint uStack_20;
  undefined4 uStack_1c;
  
  if (((this->isResolved == false) && (methodId == 0 && interfaceId == 0xc8cb212fcd9f5691)) &&
     ((((this->super_RpcClient).connectionState.ptr)->gateway).ptr.isSet == true)) {
    kj::ForkedPromise<kj::Own<capnp::ClientHook>_>::addBranch
              ((ForkedPromise<kj::Own<capnp::ClientHook>_> *)&local_58);
    newLocalPromiseClient((capnp *)&OStack_68,(Promise<kj::Own<capnp::ClientHook>_> *)&local_58);
    local_30[0] = (sizeHint->ptr).isSet;
    if ((bool)local_30[0] == true) {
      local_28 = *(undefined4 *)&(sizeHint->ptr).field_1;
      uStack_24 = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 4);
      uStack_20 = (sizeHint->ptr).field_1.value.capCount;
      uStack_1c = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 0xc);
    }
    (**(OStack_68.ptr)->_vptr_ClientHook)
              (__return_storage_ptr__,OStack_68.ptr,0xc8cb212fcd9f5691,0,local_30);
    kj::Own<capnp::ClientHook>::dispose(&OStack_68);
    kj::Own<kj::_::PromiseNode>::dispose(&local_58);
  }
  else {
    this->receivedCall = true;
    pCVar1 = (this->cap).ptr;
    local_48[0] = (sizeHint->ptr).isSet;
    if ((bool)local_48[0] == true) {
      local_40 = (sizeHint->ptr).field_1.value.wordCount;
      uStack_38 = *(undefined8 *)((long)&(sizeHint->ptr).field_1 + 8);
    }
    (**pCVar1->_vptr_ClientHook)(__return_storage_ptr__,pCVar1,interfaceId,(ulong)methodId,local_48)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

Request<AnyPointer, AnyPointer> newCall(
        uint64_t interfaceId, uint16_t methodId, kj::Maybe<MessageSize> sizeHint) override {
      if (!isResolved && interfaceId == typeId<Persistent<>>() && methodId == 0 &&
          connectionState->gateway != nullptr) {
        // This is a call to Persistent.save(), and we're not resolved yet, and the underlying
        // remote capability will perform a gateway translation. This isn't right if the promise
        // ultimately resolves to a local capability. Instead, we'll need to queue the call until
        // the promise resolves.
        return newLocalPromiseClient(fork.addBranch())
            ->newCall(interfaceId, methodId, sizeHint);
      }

      receivedCall = true;
      return cap->newCall(interfaceId, methodId, sizeHint);
    }